

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_script.cpp
# Opt level: O0

bool __thiscall DFraggleThinker::wait_finished(DFraggleThinker *this,DRunningScript *script)

{
  sector_t *psVar1;
  int iVar2;
  DSectorEffect *pDVar3;
  DRunningScript *pDVar4;
  DFsScript *pDVar5;
  DRunningScript *local_48;
  DRunningScript *current_1;
  sector_t *sec;
  FSectorTagIterator itr;
  int secnum;
  DRunningScript *current;
  DRunningScript *script_local;
  DFraggleThinker *this_local;
  
  switch(script->wait_type) {
  case 0:
    this_local._7_1_ = true;
    break;
  case 1:
    iVar2 = script->wait_data + -1;
    script->wait_data = iVar2;
    this_local._7_1_ = iVar2 < 1;
    break;
  case 2:
    FSectorTagIterator::FSectorTagIterator((FSectorTagIterator *)((long)&sec + 4),script->wait_data)
    ;
    do {
      iVar2 = FSectorTagIterator::Next((FSectorTagIterator *)((long)&sec + 4));
      psVar1 = sectors;
      if (iVar2 < 0) {
        return true;
      }
      itr.searchtag = iVar2;
      pDVar3 = ::TObjPtr::operator_cast_to_DSectorEffect_((TObjPtr *)&sectors[iVar2].floordata);
    } while (((pDVar3 == (DSectorEffect *)0x0) &&
             (pDVar3 = ::TObjPtr::operator_cast_to_DSectorEffect_
                                 ((TObjPtr *)&psVar1[iVar2].ceilingdata),
             pDVar3 == (DSectorEffect *)0x0)) &&
            (pDVar3 = ::TObjPtr::operator_cast_to_DSectorEffect_
                                ((TObjPtr *)&psVar1[iVar2].lightingdata),
            pDVar3 == (DSectorEffect *)0x0));
    this_local._7_1_ = false;
    break;
  case 3:
    pDVar4 = TObjPtr<DRunningScript>::operator->(&this->RunningScripts);
    for (register0x00000000 = ::TObjPtr::operator_cast_to_DRunningScript_((TObjPtr *)&pDVar4->next);
        stack0xffffffffffffffd8 != (DRunningScript *)0x0;
        register0x00000000 =
             ::TObjPtr::operator_cast_to_DRunningScript_((TObjPtr *)&stack0xffffffffffffffd8->next))
    {
      if ((stack0xffffffffffffffd8 != script) &&
         (pDVar5 = TObjPtr<DFsScript>::operator->(&stack0xffffffffffffffd8->script),
         pDVar5->scriptnum == script->wait_data)) {
        return false;
      }
    }
    this_local._7_1_ = true;
    break;
  case 4:
    pDVar4 = TObjPtr<DRunningScript>::operator->(&this->RunningScripts);
    for (local_48 = ::TObjPtr::operator_cast_to_DRunningScript_((TObjPtr *)&pDVar4->next);
        local_48 != (DRunningScript *)0x0;
        local_48 = ::TObjPtr::operator_cast_to_DRunningScript_((TObjPtr *)&local_48->next)) {
      if ((local_48 != script) &&
         (pDVar5 = TObjPtr<DFsScript>::operator->(&local_48->script),
         pDVar5->scriptnum == script->wait_data)) {
        return true;
      }
    }
    this_local._7_1_ = false;
    break;
  default:
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool DFraggleThinker::wait_finished(DRunningScript *script)
{
	switch(script->wait_type)
    {
    case wt_none: return true;        // uh? hehe
    case wt_scriptwait:               // waiting for script to finish
		{
			DRunningScript *current;
			for(current = RunningScripts->next; current; current = current->next)
			{
				if(current == script) continue;  // ignore this script
				if(current->script->scriptnum == script->wait_data)
					return false;        // script still running
			}
			return true;        // can continue now
		}
		
    case wt_delay:                          // just count down
		{
			return --script->wait_data <= 0;
		}
		
    case wt_tagwait:
		{
			int secnum;
			FSectorTagIterator itr(script->wait_data);
			while ((secnum = itr.Next()) >= 0)
			{
				sector_t *sec = &sectors[secnum];
				if(sec->floordata || sec->ceilingdata || sec->lightingdata)
					return false;        // not finished
			}
			return true;
		}
		
    case wt_scriptwaitpre: // haleyjd - wait for script to start
		{
			DRunningScript *current;
			for(current = RunningScripts->next; current; current=current->next)
			{
				if(current == script) continue;  // ignore this script
				if(current->script->scriptnum == script->wait_data)
					return true;        // script is now running
			}
			return false; // no running instances found
		}
		
    default: return true;
    }
	
	return false;
}